

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_file_handle_clone_cmp_func_list(fdb_file_handle *fhandle,list *cmp_func_list)

{
  void *pvVar1;
  list_elem **pplVar2;
  undefined8 *puVar3;
  size_t sVar4;
  list *in_RSI;
  long in_RDI;
  cmp_func_node *dst;
  cmp_func_node *src;
  list_elem *e;
  list_elem *local_18;
  
  if ((*(long *)(in_RDI + 0x10) == 0) && (in_RSI != (list *)0x0)) {
    pvVar1 = calloc(1,0x10);
    *(void **)(in_RDI + 0x10) = pvVar1;
    list_init(*(list **)(in_RDI + 0x10));
    for (local_18 = list_begin(in_RSI); local_18 != (list_elem *)0x0; local_18 = list_next(local_18)
        ) {
      pplVar2 = &local_18[-2].next;
      puVar3 = (undefined8 *)calloc(1,0x28);
      if (*pplVar2 == (list_elem *)0x0) {
        *puVar3 = 0;
      }
      else {
        sVar4 = strlen((char *)*pplVar2);
        pvVar1 = calloc(1,sVar4 + 1);
        *puVar3 = pvVar1;
        strcpy((char *)*puVar3,(char *)*pplVar2);
      }
      puVar3[1] = local_18[-1].prev;
      puVar3[2] = local_18[-1].next;
      list_push_back(*(list **)(in_RDI + 0x10),(list_elem *)(puVar3 + 3));
    }
  }
  return;
}

Assistant:

void fdb_file_handle_clone_cmp_func_list(fdb_file_handle *fhandle,
                                         struct list *cmp_func_list)
{
    struct list_elem *e;
    struct cmp_func_node *src, *dst;

    if (fhandle->cmp_func_list || /* already exist */
        !cmp_func_list) {
        return;
    }

    fhandle->cmp_func_list = (struct list*)calloc(1, sizeof(struct list));
    list_init(fhandle->cmp_func_list);

    e = list_begin(cmp_func_list);
    while (e) {
        src = _get_entry(e, struct cmp_func_node, le);
        dst = (struct cmp_func_node*)calloc(1, sizeof(struct cmp_func_node));
        if (src->kvs_name) {
            dst->kvs_name = (char*)calloc(1, strlen(src->kvs_name)+1);
            strcpy(dst->kvs_name, src->kvs_name);
        } else {
            dst->kvs_name = NULL; // default KVS
        }
        dst->func = src->func;
        dst->user_param = src->user_param;
        list_push_back(fhandle->cmp_func_list, &dst->le);
        e = list_next(&src->le);
    }
}